

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O2

int64_t __thiscall TPZGraphElT::EqNum(TPZGraphElT *this,TPZVec<int> *co)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int64_t iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  TPZGraphNode *this_00;
  int iVar8;
  int orient [3];
  
  iVar1 = ((this->super_TPZGraphEl).fGraphMesh)->fResolution;
  lVar7 = 0;
  while (lVar7 != 3) {
    lVar5 = 0;
    if (lVar7 != 2) {
      lVar5 = lVar7 + 1;
    }
    orient[lVar7] =
         (uint)(this->fConnects[lVar5]->fSequenceNumber < this->fConnects[lVar7]->fSequenceNumber);
    lVar7 = lVar7 + 1;
  }
  iVar8 = 1 << ((byte)iVar1 & 0x1f);
  piVar3 = co->fStore;
  iVar1 = *piVar3;
  if ((iVar1 == 0) && (piVar3[1] == 0)) {
    this_00 = this->fConnects[0];
  }
  else if ((iVar1 == iVar8) && (piVar3[1] == 0)) {
    this_00 = this->fConnects[1];
  }
  else {
    iVar2 = piVar3[1];
    if ((iVar1 != 0) || (iVar2 != iVar8)) {
      if (iVar2 == 0) {
        iVar4 = TPZGraphNode::FirstPoint(this->fConnects[3]);
        iVar4 = iVar4 + *co->fStore + (long)(iVar8 + *co->fStore * -2) * (long)orient[0] + -1;
      }
      else {
        if (iVar2 + iVar1 == iVar8) {
          iVar4 = TPZGraphNode::FirstPoint(this->fConnects[4]);
          uVar6 = *co->fStore;
          lVar7 = (int)(~uVar6 + iVar8) + iVar4;
        }
        else {
          if (iVar1 != 0) {
            iVar4 = TPZGraphNode::FirstPoint(this->fConnects[6]);
            lVar5 = iVar4 + co->fStore[1] + -1;
            iVar8 = iVar8 + -2;
            for (lVar7 = 1; lVar7 < *co->fStore; lVar7 = lVar7 + 1) {
              lVar5 = lVar5 + iVar8;
              iVar8 = iVar8 + -1;
            }
            return lVar5;
          }
          iVar4 = TPZGraphNode::FirstPoint(this->fConnects[5]);
          uVar6 = co->fStore[1];
          lVar7 = (int)(~uVar6 + iVar8) + iVar4;
          orient[1] = orient[2];
        }
        iVar4 = (long)(int)(uVar6 * 2 - iVar8) * (long)orient[1] + lVar7;
      }
      return iVar4;
    }
    this_00 = this->fConnects[2];
  }
  iVar4 = TPZGraphNode::FirstPoint(this_00);
  return iVar4;
}

Assistant:

int64_t TPZGraphElT::EqNum(TPZVec<int> &co){
	int orient[3];
	int loc;
	int res = fGraphMesh->Res();
	int imax = (1<<res);
	for(int is=0;is<3;is++) {
		orient[is] = (fConnects[is]->SequenceNumber() > fConnects[(is+1)%3]->SequenceNumber()) ? 1 : 0;
	}
	if(co[0]==0 && co[1]==0) return fConnects[0]->FirstPoint();
	if(co[0]==imax && co[1]==0) return fConnects[1]->FirstPoint();
	if(co[0]==0 && co[1]==imax) return fConnects[2]->FirstPoint();
	
	if(co[1]==0) loc = 0;
	else if(co[0]+co[1]==imax) loc=1;
	else if(co[0]==0) loc=2;
	else loc=3;
	int64_t first = fConnects[3+loc]->FirstPoint();
	int64_t neq;
	switch(loc) {
		case 0:
			neq = first + (co[0]-1) + orient[loc]*(imax-1-co[0]-co[0]+1);
			break;
		case 1:
			neq = first + (imax-1-co[0]) + orient[loc]*(co[0]-1-imax+1+co[0]);
			break;
		case 2:
			neq = first + (imax-1-co[1]) + orient[loc]*(co[1]-1-imax+1+co[1]);
			break;
		case 3:
		{
			neq = first + (co[1]-1);
			for(int run=1;run<co[0];run++) neq += imax-run-1;
			break;
		}
		default:
			neq = 0;
			break;
	}
	return neq;
}